

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O3

compile_errcode __thiscall VariableDefinition::Parse(VariableDefinition *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  long *plVar2;
  size_type *psVar3;
  char *pcVar4;
  undefined4 uVar5;
  char *pcVar6;
  allocator local_69;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48 [2];
  char local_38 [16];
  
  uVar5 = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(uVar5) {
    case 0:
      uVar5 = 1;
      if ((SVar1 & ~SWITCH_SYM) != INT_SYM) {
        return -1;
      }
      break;
    case 1:
      uVar5 = 2;
      if (SVar1 != IDENTIFIER_SYM) {
        std::__cxx11::string::string((string *)local_48,symbol_name_string[SVar1],&local_69);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x15ece2);
        psVar3 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_68.field_2._M_allocated_capacity = *psVar3;
          local_68.field_2._8_8_ = plVar2[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar3;
          local_68._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_68._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        GrammaErrorLogs(log_tools_ptr,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if (local_48[0] ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38) {
          return -1;
        }
LAB_0012af19:
        operator_delete(local_48[0]);
        return -1;
      }
      break;
    case 2:
      if (SVar1 == L_SQUARE_BRACKET_SYM) {
        uVar5 = 0xb;
      }
      else {
        if (SVar1 == SEMICOLON_SYM) goto LAB_0012ae98;
        if (SVar1 != COMMA_SYM) {
          pcVar6 = "expected a \'[\' or \',\' or \';\'";
          pcVar4 = "";
          goto LAB_0012b029;
        }
        uVar5 = 1;
      }
      break;
    case 3:
      return 0;
    case 0xb:
      uVar5 = 0xc;
      if (SVar1 != INTERGER_SYM) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"expected a valid identifier","");
        GrammaErrorLogs(log_tools_ptr,&local_68);
        local_48[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return -1;
        }
        goto LAB_0012af19;
      }
      break;
    case 0xc:
      uVar5 = 0xd;
      if (SVar1 != R_SQUARE_BRACKET_SYM) {
        pcVar6 = "expected a \']\'";
        pcVar4 = "";
LAB_0012b029:
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar6,pcVar4);
        GrammaErrorLogs(log_tools_ptr,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
          return 0;
        }
        return 0;
      }
      break;
    case 0xd:
      uVar5 = 1;
      if (SVar1 != COMMA_SYM) {
        if (SVar1 != SEMICOLON_SYM) {
          pcVar6 = "expected a \',\' or \';\'";
          pcVar4 = "";
          goto LAB_0012b029;
        }
LAB_0012ae98:
        uVar5 = 3;
      }
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode VariableDefinition::Parse() {
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier, but get a " + string(symbol_name_string[name]));
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_SQUARE_BRACKET_SYM) {
                    state = 11;
                    break;
                } else if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '[' or ',' or ';'");
                    //return NOT_MATCH;
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 3: return COMPILE_OK;
            case 11: {
                if (name == INTERGER_SYM) {
                    state = 12;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier");
                    return NOT_MATCH;
                }
            }
            case 12: {
                if (name == R_SQUARE_BRACKET_SYM) {
                    state = 13;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ']'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 13: {
                if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ',' or ';'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}